

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

TypedExpectation<cv::Mat_(cv::Mat,_cv::Rect_<int>)> * __thiscall
testing::internal::MockSpec<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::InternalExpectedAt
          (MockSpec<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *this,char *file,int line,char *obj,
          char *call)

{
  TypedExpectation<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string source_text;
  allocator local_31;
  
  std::__cxx11::string::string((string *)&local_98,"EXPECT_CALL(",&local_31);
  std::operator+(&local_b8,&local_98,obj);
  std::operator+(&local_d8,&local_b8,", ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&source_text.field_2 + 8),&local_d8,call);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&source_text.field_2 + 8),")");
  std::__cxx11::string::~string((string *)(source_text.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&source_text.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 " invoked");
  LogWithLocation(kInfo,file,line,(string *)((long)&source_text.field_2 + 8));
  std::__cxx11::string::~string((string *)(source_text.field_2._M_local_buf + 8));
  pTVar1 = FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::AddNewExpectation
                     (this->function_mocker_,file,line,(string *)local_78,&this->matchers_);
  std::__cxx11::string::~string((string *)local_78);
  return pTVar1;
}

Assistant:

internal::TypedExpectation<F>& InternalExpectedAt(
      const char* file, int line, const char* obj, const char* call) {
    const string source_text(string("EXPECT_CALL(") + obj + ", " + call + ")");
    LogWithLocation(internal::kInfo, file, line, source_text + " invoked");
    return function_mocker_->AddNewExpectation(
        file, line, source_text, matchers_);
  }